

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

double __thiscall
duckdb::Interpolator<false>::
Interpolate<unsigned_long,double,duckdb::QuantileIndirect<duckdb::hugeint_t>>
          (Interpolator<false> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<duckdb::hugeint_t> *accessor)

{
  double dVar1;
  double dVar2;
  double dVar3;
  RESULT_TYPE RVar4;
  unsigned_long local_30;
  unsigned_long local_28;
  
  local_30 = hidx;
  local_28 = lidx;
  RVar4 = QuantileIndirect<duckdb::hugeint_t>::operator()(accessor,&local_28);
  dVar1 = Cast::Operation<duckdb::hugeint_t,double>(RVar4);
  if (lidx != hidx) {
    RVar4 = QuantileIndirect<duckdb::hugeint_t>::operator()(accessor,&local_30);
    dVar2 = Cast::Operation<duckdb::hugeint_t,double>(RVar4);
    dVar3 = this->RN -
            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0));
    dVar1 = dVar1 * (1.0 - dVar3) + dVar3 * dVar2;
  }
  return dVar1;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		if (lidx == hidx) {
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
		} else {
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(hidx), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}